

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * psd_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  uint32 uVar2;
  int iVar3;
  int iVar4;
  uint32 uVar5;
  int iVar6;
  uint uVar7;
  int *in_RCX;
  uint32 *in_RDX;
  uint32 *in_RSI;
  stbi *in_RDI;
  int in_R8D;
  uint8 *p_1;
  uint32 val;
  uint8 *p;
  uint8 *out;
  int h;
  int w;
  int len;
  int count;
  int i;
  int channel;
  int compression;
  int channelCount;
  int pixelCount;
  undefined8 in_stack_ffffffffffffff78;
  stbi *s_00;
  stbi *in_stack_ffffffffffffff80;
  uchar *local_70;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uchar *in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uchar *local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  uVar2 = get32(in_stack_ffffffffffffff80);
  if (uVar2 == 0x38425053) {
    iVar3 = get16(in_stack_ffffffffffffff80);
    if (iVar3 == 1) {
      skip(in_stack_ffffffffffffff80,iVar4);
      iVar4 = get16(in_stack_ffffffffffffff80);
      if ((iVar4 < 0) || (0x10 < iVar4)) {
        e("Unsupported number of channels in PSD image");
        local_8 = (uchar *)0x0;
      }
      else {
        uVar2 = get32(in_stack_ffffffffffffff80);
        uVar5 = get32(in_stack_ffffffffffffff80);
        iVar3 = get16(in_stack_ffffffffffffff80);
        if (iVar3 == 8) {
          iVar3 = get16(in_stack_ffffffffffffff80);
          if (iVar3 == 3) {
            s_00 = in_RDI;
            get32(in_stack_ffffffffffffff80);
            skip(in_stack_ffffffffffffff80,(int)((ulong)s_00 >> 0x20));
            get32(in_RDI);
            skip(in_RDI,(int)((ulong)s_00 >> 0x20));
            get32(in_RDI);
            skip(in_RDI,(int)((ulong)s_00 >> 0x20));
            iVar3 = get16(in_RDI);
            if (iVar3 < 2) {
              local_8 = (uchar *)malloc((long)(int)(uVar5 * 4 * uVar2));
              if (local_8 == (uchar *)0x0) {
                e("Out of memory");
                local_8 = (uchar *)0x0;
              }
              else {
                iVar6 = uVar5 * uVar2;
                if (iVar3 == 0) {
                  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
                    local_70 = local_8 + local_3c;
                    if (iVar4 < local_3c) {
                      for (local_40 = 0; local_40 < iVar6; local_40 = local_40 + 1) {
                        uVar1 = '\0';
                        if (local_3c == 3) {
                          uVar1 = 0xff;
                        }
                        *local_70 = uVar1;
                        local_70 = local_70 + 4;
                      }
                    }
                    else {
                      for (local_40 = 0; local_40 < iVar6; local_40 = local_40 + 1) {
                        iVar3 = get8(s_00);
                        *local_70 = (uchar)iVar3;
                        local_70 = local_70 + 4;
                      }
                    }
                  }
                }
                else {
                  skip(in_RDI,(int)((ulong)s_00 >> 0x20));
                  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
                    in_stack_ffffffffffffffa0 = local_8 + local_3c;
                    if (local_3c < iVar4) {
                      local_44 = 0;
                      while (local_44 < iVar6) {
                        uVar7 = get8(s_00);
                        if (uVar7 != 0x80) {
                          if ((int)uVar7 < 0x80) {
                            local_48 = uVar7 + 1;
                            local_44 = local_48 + local_44;
                            for (; local_48 != 0; local_48 = local_48 + -1) {
                              iVar3 = get8(s_00);
                              *in_stack_ffffffffffffffa0 = (uchar)iVar3;
                              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 4;
                            }
                          }
                          else if (0x80 < (int)uVar7) {
                            local_48 = (uVar7 ^ 0xff) + 2;
                            in_stack_ffffffffffffff9c = get8(s_00);
                            local_44 = local_48 + local_44;
                            for (; local_48 != 0; local_48 = local_48 + -1) {
                              *in_stack_ffffffffffffffa0 = (uchar)in_stack_ffffffffffffff9c;
                              in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 4;
                            }
                          }
                        }
                      }
                    }
                    else {
                      for (local_40 = 0; local_40 < iVar6; local_40 = local_40 + 1) {
                        uVar1 = '\0';
                        if (local_3c == 3) {
                          uVar1 = 0xff;
                        }
                        *in_stack_ffffffffffffffa0 = uVar1;
                        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 4;
                      }
                    }
                  }
                }
                if (((in_R8D == 0) || (in_R8D == 4)) ||
                   (local_8 = convert_format(local_8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                                             ,(int)in_stack_ffffffffffffffa0,
                                             in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   local_8 != (uchar *)0x0)) {
                  if (in_RCX != (int *)0x0) {
                    *in_RCX = iVar4;
                  }
                  *in_RDX = uVar2;
                  *in_RSI = uVar5;
                }
              }
            }
            else {
              e("PSD has an unknown compression format");
              local_8 = (uchar *)0x0;
            }
          }
          else {
            e("PSD is not in RGB color format");
            local_8 = (uchar *)0x0;
          }
        }
        else {
          e("PSD bit depth is not 8 bit");
          local_8 = (uchar *)0x0;
        }
      }
    }
    else {
      e("Unsupported version of PSD image");
      local_8 = (uchar *)0x0;
    }
  }
  else {
    e("Corrupt PSD image");
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

static stbi_uc *psd_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	int	pixelCount;
	int channelCount, compression;
	int channel, i, count, len;
   int w,h;
   uint8 *out;

	// Check identifier
	if (get32(s) != 0x38425053)	// "8BPS"
		return epuc("not PSD", "Corrupt PSD image");

	// Check file type version.
	if (get16(s) != 1)
		return epuc("wrong version", "Unsupported version of PSD image");

	// Skip 6 reserved bytes.
	skip(s, 6 );

	// Read the number of channels (R, G, B, A, etc).
	channelCount = get16(s);
	if (channelCount < 0 || channelCount > 16)
		return epuc("wrong channel count", "Unsupported number of channels in PSD image");

	// Read the rows and columns of the image.
   h = get32(s);
   w = get32(s);

	// Make sure the depth is 8 bits.
	if (get16(s) != 8)
		return epuc("unsupported bit depth", "PSD bit depth is not 8 bit");

	// Make sure the color mode is RGB.
	// Valid options are:
	//   0: Bitmap
	//   1: Grayscale
	//   2: Indexed color
	//   3: RGB color
	//   4: CMYK color
	//   7: Multichannel
	//   8: Duotone
	//   9: Lab color
	if (get16(s) != 3)
		return epuc("wrong color format", "PSD is not in RGB color format");

	// Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
	skip(s,get32(s) );

	// Skip the image resources.  (resolution, pen tool paths, etc)
	skip(s, get32(s) );

	// Skip the reserved data.
	skip(s, get32(s) );

	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	compression = get16(s);
	if (compression > 1)
		return epuc("bad compression", "PSD has an unknown compression format");

	// Create the destination image.
	out = (stbi_uc *) malloc(4 * w*h);
	if (!out) return epuc("outofmem", "Out of memory");
   pixelCount = w*h;

	// Initialize the data to zero.
	//memset( out, 0, pixelCount * 4 );

	// Finally, the image data.
	if (compression) {
		// RLE as used by .PSD and .TIFF
		// Loop until you get the number of unpacked bytes you are expecting:
		//     Read the next source byte into n.
		//     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
		//     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
		//     Else if n is 128, noop.
		// Endloop

		// The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
		// which we're going to just skip.
		skip(s, h * channelCount * 2 );

		// Read the RLE data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out+channel;
			if (channel >= channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = (channel == 3 ? 255 : 0), p += 4;
			} else {
				// Read the RLE data.
				count = 0;
				while (count < pixelCount) {
					len = get8(s);
					if (len == 128) {
						// No-op.
					} else if (len < 128) {
						// Copy next len+1 bytes literally.
						len++;
						count += len;
						while (len) {
							*p = get8(s);
                     p += 4;
							len--;
						}
					} else if (len > 128) {
						uint32	val;
						// Next -len+1 bytes in the dest are replicated from next source byte.
						// (Interpret len as a negative 8-bit int.)
						len ^= 0x0FF;
						len += 2;
                  val = get8(s);
						count += len;
						while (len) {
							*p = val;
                     p += 4;
							len--;
						}
					}
				}
			}
		}

	} else {
		// We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.

		// Read the data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out + channel;
			if (channel > channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = channel == 3 ? 255 : 0, p += 4;
			} else {
				// Read the data.
				count = 0;
				for (i = 0; i < pixelCount; i++)
					*p = get8(s), p += 4;
			}
		}
	}

	if (req_comp && req_comp != 4) {
		out = convert_format(out, 4, req_comp, w, h);
		if (out == NULL) return out; // convert_format frees input on failure
	}

	if (comp) *comp = channelCount;
	*y = h;
	*x = w;

	return out;
}